

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDocument.cpp
# Opt level: O1

void json::JsonDocument::writeNode(ostream *output,JsonNode *node,string *indent,size_t tabSize)

{
  pointer *pppVar1;
  pointer ppVar2;
  bool bVar3;
  int iVar4;
  JsonArray *this;
  long *plVar5;
  undefined4 extraout_var;
  double *pdVar6;
  undefined4 extraout_var_00;
  bool *pbVar7;
  JsonObject *this_00;
  undefined8 *puVar8;
  ostream *poVar9;
  undefined4 extraout_var_01;
  JsonNode *pJVar10;
  size_t sVar11;
  undefined4 extraout_var_02;
  size_type *psVar12;
  ulong uVar13;
  char *pcVar14;
  pointer ppVar15;
  const_iterator __end3;
  string newIndent;
  const_iterator __begin3;
  char local_d1;
  const_iterator local_d0;
  string local_c8;
  string *local_a8;
  size_t local_a0;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
  local_98;
  JsonObject *local_78;
  string local_70;
  string local_50;
  
  local_a0 = tabSize;
  iVar4 = (*node->_vptr_JsonNode[2])(node);
  switch(iVar4) {
  case 0:
    local_a8 = indent;
    this = JsonNode::operator_cast_to_JsonArray_(node);
    local_c8._M_dataplus._M_p._0_1_ = 0x5b;
    std::__ostream_insert<char,std::char_traits<char>>(output,(char *)&local_c8,1);
    bVar3 = JsonArray::empty(this);
    if (!bVar3) {
      local_c8._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(output,(char *)&local_c8,1);
    }
    pppVar1 = &local_98.
               super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pppVar1;
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)local_a0);
    plVar5 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_98,0,(char *)0x0,(ulong)(local_a8->_M_dataplus)._M_p);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    psVar12 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_c8.field_2._M_allocated_capacity = *psVar12;
      local_c8.field_2._8_8_ = plVar5[3];
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar12;
      local_c8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_c8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar12;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_98.
        super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)pppVar1) {
      operator_delete(local_98.
                      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    local_98.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)JsonArray::begin(this);
    local_d0._M_current =
         (unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_> *)JsonArray::end(this);
    while (bVar3 = JsonArray::const_iterator::operator!=
                             ((const_iterator *)&local_98,(const_iterator *)&local_d0), bVar3) {
      pJVar10 = JsonArray::const_iterator::operator*((const_iterator *)&local_98);
      std::__ostream_insert<char,std::char_traits<char>>
                (output,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_c8._M_dataplus._M_p,
                 local_c8._M_dataplus._M_p + local_c8._M_string_length);
      writeNode(output,pJVar10,&local_50,local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      sVar11 = JsonArray::getChildCount(this);
      iVar4 = (*(this->super_JsonNode)._vptr_JsonNode[0x10])(this,sVar11 - 1);
      if (pJVar10 != (JsonNode *)CONCAT44(extraout_var_02,iVar4)) {
        local_d1 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(output,&local_d1,1);
      }
      local_d1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(output,&local_d1,1);
      JsonArray::const_iterator::operator++((const_iterator *)&local_98);
    }
    bVar3 = JsonArray::empty(this);
    if (!bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                (output,(local_a8->_M_dataplus)._M_p,local_a8->_M_string_length);
    }
    local_98.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_98.
                           super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(output,(char *)&local_98,1);
    break;
  case 1:
    this_00 = JsonNode::operator_cast_to_JsonObject_(node);
    local_c8._M_dataplus._M_p._0_1_ = 0x7b;
    std::__ostream_insert<char,std::char_traits<char>>(output,(char *)&local_c8,1);
    bVar3 = JsonObject::empty(this_00);
    if (!bVar3) {
      local_c8._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(output,(char *)&local_c8,1);
    }
    pppVar1 = &local_98.
               super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pppVar1;
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)local_a0);
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_98,0,(char *)0x0,(ulong)(indent->_M_dataplus)._M_p);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    psVar12 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_c8.field_2._M_allocated_capacity = *psVar12;
      local_c8.field_2._8_8_ = puVar8[3];
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar12;
      local_c8._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_c8._M_string_length = puVar8[1];
    *puVar8 = psVar12;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    local_a8 = indent;
    if (local_98.
        super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)pppVar1) {
      operator_delete(local_98.
                      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    local_78 = this_00;
    JsonObject::sort_abi_cxx11_(&local_98,this_00);
    ppVar2 = local_98.
             super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_98.
        super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_98.
        super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar15 = local_98.
                super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (output,local_c8._M_dataplus._M_p,local_c8._M_string_length);
        local_d0._M_current._0_1_ = 0x22;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_d0,1);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(char *)(ppVar15->first->_M_dataplus)._M_p,
                            (long)ppVar15->first->_M_string_length);
        local_d0._M_current._0_1_ = 0x22;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_d0,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
        pJVar10 = ppVar15->second;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_c8._M_dataplus._M_p,
                   local_c8._M_dataplus._M_p + local_c8._M_string_length);
        writeNode(output,pJVar10,&local_70,local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (ppVar15->second !=
            local_98.
            super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].second) {
          local_d0._M_current._0_1_ = 0x2c;
          std::__ostream_insert<char,std::char_traits<char>>(output,(char *)&local_d0,1);
        }
        local_d0._M_current._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(output,(char *)&local_d0,1);
        ppVar15 = ppVar15 + 1;
      } while (ppVar15 != ppVar2);
    }
    bVar3 = JsonObject::empty(local_78);
    if (!bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                (output,(local_a8->_M_dataplus)._M_p,local_a8->_M_string_length);
    }
    local_d0._M_current._0_1_ = 0x7d;
    std::__ostream_insert<char,std::char_traits<char>>(output,(char *)&local_d0,1);
    if (local_98.
        super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.
                      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    break;
  case 2:
    iVar4 = (*node->_vptr_JsonNode[8])(node);
    pbVar7 = JsonBool::operator_cast_to_bool_((JsonBool *)CONCAT44(extraout_var_00,iVar4));
    pcVar14 = "false";
    if ((ulong)*pbVar7 != 0) {
      pcVar14 = "true";
    }
    uVar13 = (ulong)*pbVar7 ^ 5;
    goto LAB_00104f0b;
  case 3:
    pcVar14 = "null";
    uVar13 = 4;
LAB_00104f0b:
    std::__ostream_insert<char,std::char_traits<char>>(output,pcVar14,uVar13);
    return;
  case 4:
    iVar4 = (*node->_vptr_JsonNode[0xc])(node);
    pdVar6 = JsonNumber::operator_cast_to_double_((JsonNumber *)CONCAT44(extraout_var,iVar4));
    std::ostream::_M_insert<double>(*pdVar6);
    return;
  case 5:
    local_c8._M_dataplus._M_p._0_1_ = 0x22;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(output,(char *)&local_c8,1);
    iVar4 = (*node->_vptr_JsonNode[0xe])(node);
    JsonString::escaped_abi_cxx11_(&local_c8,(JsonString *)CONCAT44(extraout_var_01,iVar4));
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_c8._M_dataplus._M_p,local_c8._M_string_length);
    local_98.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_98.
                           super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_json::JsonNode_&>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_98,1);
    break;
  default:
    goto switchD_00104df5_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
switchD_00104df5_default:
  return;
}

Assistant:

void JsonDocument::writeNode(std::ostream &output, const JsonNode &node, std::string indent, size_t tabSize)
    {
        switch (node.getType())
        {
        case JsonNodeType::Array:
        {
            const JsonArray &array = node;

            output << '[';

            // If the array is empty we would like to print [] without a newline in the middle.
            if (!array.empty())
                output << '\n';

            // Calculate new indent for child nodes.
            std::string newIndent = indent + std::string(tabSize, ' ');

            for (const JsonNode &child : array)
            {
                output << newIndent;
                writeNode(output, child, newIndent, tabSize);
                if (&child != &array[array.getChildCount() - 1]) // If last child don't print ','.
                    output << ',';
                output << '\n';
            }

            // Same reasoning as previous array.empty() check, we don't want spaces in the middle of [].
            if (!array.empty())
                output << indent;

            output << ']';
        }
        break;
        case JsonNodeType::Object:
        {
            const JsonObject &object = node;
            output << '{';

            if (!object.empty())
                output << '\n';

            std::string newIndent = indent + std::string(tabSize, ' ');

            // We want the pairs to be printed based on the insertion order therefore we sort the object first.
            // This is not necessary and will have a performance cost, but it's pretty and therefore we do it.
            std::vector<std::pair<const std::string &, const JsonNode &>> children = object.sort();
            for (const auto &pair : children)
            {
                output << newIndent << '\"' << pair.first << '\"' << ": ";
                writeNode(output, pair.second, newIndent, tabSize);
                if (&pair.second != &children[children.size() - 1].second)
                    output << ',';
                output << '\n';
            }

            if (!object.empty())
                output << indent;

            output << '}';
        }
        break;
        case JsonNodeType::Bool:
            output << (node.toBool() ? "true" : "false");
            break;
        case JsonNodeType::Null:
            output << "null";
            break;
        case JsonNodeType::Number:
            output << node.toNumber();
            break;
        case JsonNodeType::String:
            output << '\"' << node.toString().escaped() << '\"';
            break;
        }
    }